

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

FIOBJ fiobj_hash_get2(FIOBJ hash,uint64_t key_hash)

{
  size_t sVar1;
  FIOBJ FVar2;
  uint64_t key_hash_local;
  FIOBJ hash_local;
  
  if (hash != 0) {
    sVar1 = fiobj_type_is(hash,FIOBJ_T_HASH);
    if (sVar1 != 0) {
      FVar2 = fio_hash___find((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),key_hash,
                              0xffffffffffffffff);
      return FVar2;
    }
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0x138,"FIOBJ fiobj_hash_get2(const FIOBJ, uint64_t)");
}

Assistant:

FIOBJ fiobj_hash_get2(const FIOBJ hash, uint64_t key_hash) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, key_hash, -1);
  ;
}